

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O2

void __thiscall PKCS7Test_PEMCerts_Test::TestBody(PKCS7Test_PEMCerts_Test *this)

{
  int iVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  char *in_R9;
  AssertHelper local_60;
  UniquePtr<struct_stack_st_X509> certs;
  AssertHelper local_50;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<BIO> bio;
  
  bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 BIO_new_mem_buf("-----BEGIN PKCS7-----\nMIID+wYJKoZIhvcNAQcCoIID7DCCA+gCAQExADALBgkqhkiG9w0BBwGgggPQMIID\nzDCCArSgAwIBAgIIWesoywKxoNQwDQYJKoZIhvcNAQELBQAwSTELMAkGA1UEBhMC\nVVMxEzARBgNVBAoTCkdvb2dsZSBJbmMxJTAjBgNVBAMTHEdvb2dsZSBJbnRlcm5l\ndCBBdXRob3JpdHkgRzIwHhcNMTUwMjExMTQxNTA2WhcNMTUwNTEyMDAwMDAwWjBp\nMQswCQYDVQQGEwJVUzETMBEGA1UECAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91\nbnRhaW4gVmlldzETMBEGA1UECgwKR29vZ2xlIEluYzEYMBYGA1UEAwwPbWFpbC5n\nb29nbGUuY29tMFkwEwYHKoZIzj0CAQYIKoZIzj0DAQcDQgAE7MdALmCkcRRf/tzQ\na8eu3J7S5CTQa5ns0ReF9ktlbB1RL56BVGAu4p7BrT32D6gDpiggXq3gxN81A0TG\nC2yICKOCAWEwggFdMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAsBgNV\nHREEJTAjgg9tYWlsLmdvb2dsZS5jb22CEGluYm94Lmdvb2dsZS5jb20wCwYDVR0P\nBAQDAgeAMGgGCCsGAQUFBwEBBFwwWjArBggrBgEFBQcwAoYfaHR0cDovL3BraS5n\nb29nbGUuY29tL0dJQUcyLmNydDArBggrBgEFBQcwAYYfaHR0cDovL2NsaWVudHMx\nLmdvb2dsZS5jb20vb2NzcDAdBgNVHQ4EFgQUQqsYsRoWLiG6qmV2N1mpYaHawxAw\nDAYDVR0TAQH/BAIwADAfBgNVHSMEGDAWgBRK3QYWG7z2aLV29YG2u2IaulqBLzAX\nBgNVHSAEEDAOMAwGCisGAQQB1nkCBQEwMAYDVR0fBCkwJzAloCOgIYYfaHR0cDov\nL3BraS5nb29nbGUuY29tL0dJQUcyLmNybDANBgkqhkiG9w0BAQsFAAOCAQEAKNh3\nisNuGBisPKVlekOsZR6S8oP/fS/xt6Hqvg0EwFXvhxoJ40rxAB2LMykY17e+ln3P\nMwBBlRkwY1btcDT15JwzgaZb38rq/r+Pkb5Qgmx/InA/pw0QHDtwHQp5uXZuvu6p\nJ/SlCwyq7EOvByWdVQcMU/dhGa3idXEkn/zwfqcG6YjdWKoDmXWZYv3RiP3wJcRB\n9+3U1wOe3uebnZLRWO6/w0to1XY8TFHklyw5rwIE5sbxOx5N3Ne8+GgPrUDvGAz0\nrAUKnh3b7GNXL1qlZh2qkhB6rUzvtPpg397Asg3xVtExCHOk4zPqzzicttoEbVVy\n0T8rIMUNwC4Beh4JVjEA\n-----END PKCS7-----\n"
                                 ,0x594);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<bio_st_*,_bssl::internal::Deleter>)
       bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl != (_Head_base<0UL,_bio_st_*,_false>)0x0;
  if ((tuple<bio_st_*,_bssl::internal::Deleter>)
      bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (_Head_base<0UL,_bio_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&certs);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x5104cb,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0xf2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&certs);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>)
        certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                            ._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_002f6f0e;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)OPENSSL_sk_new_null();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<stack_st_X509_*,_bssl::internal::Deleter>)
       certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
       (_Head_base<0UL,_stack_st_X509_*,_false>)0x0;
  if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)
      certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x527c94,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0xf4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
LAB_002f6e88:
    this_00 = &gtest_ar_.message_;
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = PKCS7_get_PEM_certificates
                      ((stack_st_X509 *)
                       certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,
                       (BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"PKCS7_get_PEM_certificates(certs.get(), bio.get())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0xf6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
      goto LAB_002f6e88;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    local_60.data_._0_4_ = 1;
    gtest_ar_._0_8_ =
         OPENSSL_sk_num((OPENSSL_STACK *)
                        certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"1u","sk_X509_num(certs.get())",(uint *)&local_60,
               (unsigned_long *)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0xf7,message);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    this_00 = &gtest_ar.message_;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&certs);
LAB_002f6f0e:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio);
  return;
}

Assistant:

static void TestPEMCerts(const char *pem) {
  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(pem, strlen(pem)));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);

  ASSERT_TRUE(PKCS7_get_PEM_certificates(certs.get(), bio.get()));
  ASSERT_EQ(1u, sk_X509_num(certs.get()));
}